

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O0

ze_image_format_type_t to_format_type(string *format_type)

{
  bool bVar1;
  string *format_type_local;
  
  bVar1 = std::operator==(format_type,"UINT");
  if (bVar1) {
    format_type_local._4_4_ = ZE_IMAGE_FORMAT_TYPE_UINT;
  }
  else {
    bVar1 = std::operator==(format_type,"SINT");
    if (bVar1) {
      format_type_local._4_4_ = ZE_IMAGE_FORMAT_TYPE_SINT;
    }
    else {
      bVar1 = std::operator==(format_type,"UNORM");
      if (bVar1) {
        format_type_local._4_4_ = ZE_IMAGE_FORMAT_TYPE_UNORM;
      }
      else {
        bVar1 = std::operator==(format_type,"SNORM");
        if (bVar1) {
          format_type_local._4_4_ = ZE_IMAGE_FORMAT_TYPE_SNORM;
        }
        else {
          bVar1 = std::operator==(format_type,"FLOAT");
          if (bVar1) {
            format_type_local._4_4_ = ZE_IMAGE_FORMAT_TYPE_FLOAT;
          }
          else {
            std::operator<<((ostream *)&std::cout,"Unknown ze_image_format_type_t value: ");
            format_type_local._4_4_ = ~ZE_IMAGE_FORMAT_TYPE_UINT;
          }
        }
      }
    }
  }
  return format_type_local._4_4_;
}

Assistant:

ze_image_format_type_t to_format_type(const std::string format_type) {
  if (format_type == "UINT") {
    return ZE_IMAGE_FORMAT_TYPE_UINT;
  } else if (format_type == "SINT") {
    return ZE_IMAGE_FORMAT_TYPE_SINT;
  } else if (format_type == "UNORM") {
    return ZE_IMAGE_FORMAT_TYPE_UNORM;
  } else if (format_type == "SNORM") {
    return ZE_IMAGE_FORMAT_TYPE_SNORM;
  } else if (format_type == "FLOAT") {
    return ZE_IMAGE_FORMAT_TYPE_FLOAT;
  } else {
    std::cout << "Unknown ze_image_format_type_t value: ";
    return (static_cast<ze_image_format_type_t>(-1));
  }
}